

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepSubstring *
absl::lts_20250127::cord_internal::anon_unknown_0::CreateSubstring
          (CordRep *rep,size_t offset,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRepSubstring *pCVar3;
  CordRep *pCVar4;
  
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x76,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length < n + offset) {
    __assert_fail("offset + n <= rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x77,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length == n && offset == 0) {
    __assert_fail("offset != 0 || n != rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x78,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  pCVar4 = rep;
  if (rep->tag == '\x01') {
    pCVar4 = *(CordRep **)&rep[1].refcount;
    if (pCVar4 == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
    }
    offset = offset + rep[1].length;
    LOCK();
    (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    LOCK();
    pRVar1 = &rep->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      CordRep::Destroy(rep);
    }
  }
  if (pCVar4->tag < 5) {
    __assert_fail("rep->IsExternal() || rep->IsFlat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x80,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  pCVar3 = (CordRepSubstring *)operator_new(0x20);
  (pCVar3->super_CordRep).length = 0;
  (pCVar3->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar3->super_CordRep).tag = '\0';
  (pCVar3->super_CordRep).storage[0] = '\0';
  (pCVar3->super_CordRep).storage[1] = '\0';
  (pCVar3->super_CordRep).storage[2] = '\0';
  pCVar3->start = 0;
  pCVar3->child = (CordRep *)0x0;
  (pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  (pCVar3->super_CordRep).length = n;
  (pCVar3->super_CordRep).tag = '\x01';
  pCVar3->start = offset;
  pCVar3->child = pCVar4;
  return pCVar3;
}

Assistant:

CordRepSubstring* CreateSubstring(CordRep* rep, size_t offset, size_t n) {
  assert(n != 0);
  assert(offset + n <= rep->length);
  assert(offset != 0 || n != rep->length);

  if (rep->tag == SUBSTRING) {
    CordRepSubstring* substring = rep->substring();
    offset += substring->start;
    rep = CordRep::Ref(substring->child);
    CordRep::Unref(substring);
  }
  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = rep;
  return substring;
}